

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

bool __thiscall cmLocalGenerator::CheckDefinition(cmLocalGenerator *this,string *define)

{
  long lVar1;
  ostream *poVar2;
  ostringstream e;
  long *local_1a8;
  long local_198 [2];
  undefined1 local_188 [376];
  
  lVar1 = std::__cxx11::string::find_first_of((char *)define,0x596fb3,0);
  if ((lVar1 == -1) || ((define->_M_dataplus)._M_p[lVar1] != '(')) {
    lVar1 = std::__cxx11::string::find_first_of((char *)define,0x58c8ed,0);
    if (lVar1 == -1) {
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"WARNING: Preprocessor definitions containing \'#\' may not be "
               ,0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"passed on the compiler command line because many compilers ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"do not support it.\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"CMake is dropping a preprocessor definition: ",0x2d);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_188,(define->_M_dataplus)._M_p,define->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Consider defining the macro in a (configured) header file.\n",0x3b);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((char *)local_1a8,(char *)0x0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"WARNING: Function-style preprocessor definitions may not be ",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"passed on the compiler command line because many compilers ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"do not support it.\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"CMake is dropping a preprocessor definition: ",0x2d);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_188,(define->_M_dataplus)._M_p,define->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Consider defining the macro in a (configured) header file.\n",0x3b);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((char *)local_1a8,(char *)0x0);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return false;
}

Assistant:

bool cmLocalGenerator::CheckDefinition(std::string const& define) const
{
  // Many compilers do not support -DNAME(arg)=sdf so we disable it.
  std::string::size_type pos = define.find_first_of("(=");
  if (pos != std::string::npos)
    {
    if (define[pos] == '(')
      {
      std::ostringstream e;
      e << "WARNING: Function-style preprocessor definitions may not be "
        << "passed on the compiler command line because many compilers "
        << "do not support it.\n"
        << "CMake is dropping a preprocessor definition: " << define << "\n"
        << "Consider defining the macro in a (configured) header file.\n";
      cmSystemTools::Message(e.str().c_str());
      return false;
      }
    }

  // Many compilers do not support # in the value so we disable it.
  if(define.find_first_of("#") != define.npos)
    {
    std::ostringstream e;
    e << "WARNING: Preprocessor definitions containing '#' may not be "
      << "passed on the compiler command line because many compilers "
      << "do not support it.\n"
      << "CMake is dropping a preprocessor definition: " << define << "\n"
      << "Consider defining the macro in a (configured) header file.\n";
    cmSystemTools::Message(e.str().c_str());
    return false;
    }

  // Assume it is supported.
  return true;
}